

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameForDecPOMDPStage.cpp
# Opt level: O1

void __thiscall
BayesianGameForDecPOMDPStage::~BayesianGameForDecPOMDPStage(BayesianGameForDecPOMDPStage *this)

{
  pointer ppJVar1;
  pointer ppJVar2;
  
  (this->super_BayesianGameForDecPOMDPStageInterface)._vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameForDecPOMDPStage_005a1590;
  (this->super_BayesianGameIdenticalPayoff).super_BayesianGameIdenticalPayoffInterface.
  super_BayesianGameBase.super_Interface_ProblemToPolicyDiscretePure.
  super_Interface_ProblemToPolicyDiscrete._vptr_Interface_ProblemToPolicyDiscrete =
       (_func_int **)&PTR__BayesianGameForDecPOMDPStage_005a15e0;
  ppJVar1 = (this->_m_JBs).
            super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppJVar2 = (this->_m_JBs).
                 super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppJVar2 != ppJVar1;
      ppJVar2 = ppJVar2 + 1) {
    if (*ppJVar2 != (JointBeliefInterface *)0x0) {
      (**(code **)((long)**ppJVar2 + 8))();
    }
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&this->_m_immR);
  ppJVar2 = (this->_m_JBs).
            super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppJVar2 != (pointer)0x0) {
    operator_delete(ppJVar2,(long)(this->_m_JBs).
                                  super__Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppJVar2
                   );
  }
  BayesianGameIdenticalPayoff::~BayesianGameIdenticalPayoff
            (&this->super_BayesianGameIdenticalPayoff);
  (this->super_BayesianGameForDecPOMDPStageInterface)._vptr_BayesianGameForDecPOMDPStageInterface =
       (_func_int **)&PTR__BayesianGameForDecPOMDPStageInterface_005a16e0;
  boost::detail::shared_count::~shared_count
            (&(this->super_BayesianGameForDecPOMDPStageInterface)._m_pJPol.pn);
  return;
}

Assistant:

BayesianGameForDecPOMDPStage::~BayesianGameForDecPOMDPStage()
{
    //free all the joint beliefs:
    std::vector< JointBeliefInterface* >::iterator it =  _m_JBs.begin();
    std::vector< JointBeliefInterface* >::iterator last =  _m_JBs.end();
    while(it != last)
    {
        delete *it;
        it++;
    }
}